

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_fileresult(lua_State *L,int stat,char *fname)

{
  int __errnum;
  int *piVar1;
  char *pcVar2;
  int en;
  char *fname_local;
  int stat_local;
  lua_State *L_local;
  
  piVar1 = __errno_location();
  __errnum = *piVar1;
  if (stat == 0) {
    lua_pushnil(L);
    if (fname == (char *)0x0) {
      pcVar2 = strerror(__errnum);
      lua_pushstring(L,pcVar2);
    }
    else {
      pcVar2 = strerror(__errnum);
      lua_pushfstring(L,"%s: %s",fname,pcVar2);
    }
    lua_pushinteger(L,(long)__errnum);
    L_local._4_4_ = 3;
  }
  else {
    lua_pushboolean(L,1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_fileresult (lua_State *L, int stat, const char *fname) {
  int en = errno;  /* calls to Lua API may change this value */
  if (stat) {
    lua_pushboolean(L, 1);
    return 1;
  }
  else {
    lua_pushnil(L);
    if (fname)
      lua_pushfstring(L, "%s: %s", fname, strerror(en));
    else
      lua_pushstring(L, strerror(en));
    lua_pushinteger(L, en);
    return 3;
  }
}